

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

QDateTimeEditPrivate * __thiscall
QDateTimeEditPrivate::validateAndInterpret
          (QDateTimeEditPrivate *this,QString *input,int *position,State *state,bool fixup)

{
  qsizetype *this_00;
  char16_t cVar1;
  char16_t cVar2;
  State SVar3;
  ulong uVar4;
  storage_type_conflict *psVar5;
  ulong uVar6;
  char16_t *pcVar7;
  QArrayData *pQVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  char cVar11;
  short sVar12;
  short sVar13;
  uint uVar14;
  bool bVar16;
  undefined7 in_register_00000081;
  uint *puVar17;
  char in_R9B;
  uint uVar18;
  ulong uVar19;
  long in_FS_OFFSET;
  QStringView QVar20;
  QStringView QVar21;
  QArrayData *local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  QArrayData *local_78;
  undefined8 uStack_70;
  undefined1 *local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  ulong uVar15;
  
  puVar17 = (uint *)CONCAT71(in_register_00000081,fixup);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = *(ulong *)(position + 4);
  if (uVar4 == 0) {
    uVar14 = 1;
    if (input[0x2b].d.size != 1) {
      uVar14 = (uint)(input[0x1b].d.size != 0);
    }
    *puVar17 = uVar14;
    (*(code *)(input->d).d[10].super_QArrayData.alloc)(&local_58,input);
    ::QVariant::toDateTime();
    ::QVariant::~QVariant((QVariant *)&local_58);
  }
  else {
    psVar5 = *(storage_type_conflict **)(position + 2);
    if ((input[0x22].d.size == uVar4) &&
       (QVar20.m_data = input[0x22].d.ptr, QVar20.m_size = uVar4, QVar21.m_data = psVar5,
       QVar21.m_size = uVar4, cVar11 = QtPrivate::equalStrings(QVar20,QVar21),
       cVar11 == '\x01' && in_R9B == '\0')) {
      *puVar17 = *(uint *)&input[0x28].d.ptr;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        ::QVariant::toDateTime();
        return this;
      }
      goto LAB_003e7b11;
    }
    uVar6 = input[0x1b].d.size;
    if (uVar6 != 0) {
      uVar15 = uVar4;
      if (uVar6 < uVar4) {
        uVar15 = uVar6;
      }
      uVar14 = (uint)uVar15;
      if ((int)uVar14 < 1) {
        bVar16 = false;
        uVar18 = 0;
LAB_003e772e:
        if (uVar18 != uVar14) goto LAB_003e77cb;
        *puVar17 = (uVar6 == uVar4) + 1;
        if (bVar16) goto LAB_003e774f;
      }
      else {
        pcVar7 = input[0x1b].d.ptr;
        bVar16 = false;
        uVar15 = 0;
        do {
          while( true ) {
            uVar19 = uVar15 + 1;
            cVar1 = psVar5[uVar15];
            cVar2 = pcVar7[uVar15];
            uVar15 = uVar19;
            if (cVar1 != cVar2) break;
            if (uVar19 == (uVar14 & 0x7fffffff)) {
              *puVar17 = (uVar6 == uVar4) + 1;
              if (bVar16) goto LAB_003e774f;
              goto LAB_003e77b4;
            }
          }
          sVar12 = QChar::toLower((uint)(ushort)cVar2);
          sVar13 = QChar::toLower((uint)(ushort)cVar1);
          if (sVar12 != sVar13) {
            uVar18 = (int)uVar19 - 1;
            goto LAB_003e772e;
          }
          bVar16 = true;
        } while (uVar19 != (uVar14 & 0x7fffffff));
        *puVar17 = (uVar6 == uVar4) + 1;
LAB_003e774f:
        QString::left((QString *)&local_58,input + 0x1b,(long)(int)uVar14);
        pQVar8 = *(QArrayData **)position;
        uVar9 = *(undefined8 *)(position + 2);
        *(PrivateShared **)position = local_58.shared;
        *(undefined8 *)(position + 2) = local_58._8_8_;
        uVar10 = *(undefined8 *)(position + 4);
        *(undefined8 *)(position + 4) = local_58._16_8_;
        local_58.shared = (PrivateShared *)pQVar8;
        local_58._8_8_ = uVar9;
        local_58._16_8_ = uVar10;
        if (pQVar8 != (QArrayData *)0x0) {
          LOCK();
          (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar8,2,0x10);
          }
        }
      }
LAB_003e77b4:
      ::QVariant::toDateTime();
      goto LAB_003e79ce;
    }
LAB_003e77cb:
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    uStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    SVar3 = *state;
    ::QVariant::toDateTime();
    QDateTimeParser::parse
              ((QString *)&local_78,(int)input + 0x3d8,(QDateTime *)position,SUB41(SVar3,0));
    QDateTime::~QDateTime((QDateTime *)local_58.data);
    QString::operator=((QString *)position,(QString *)(input + 0x2a));
    QDateTime::toTimeZone((QTimeZone *)&local_58.shared);
    pQVar8 = local_78;
    local_78 = (QArrayData *)local_58.shared;
    local_58.shared = (PrivateShared *)pQVar8;
    QDateTime::~QDateTime((QDateTime *)local_58.data);
    cVar11 = QDateTime::isValid();
    if ((uint)uStack_70 == 2 && cVar11 == '\0') {
      uStack_70 = (undefined1 *)CONCAT44(uStack_70._4_4_,1);
      *state = *state + uStack_70._4_4_;
      *puVar17 = 1;
LAB_003e796c:
      (*(code *)(input->d).d[0xf].super_QArrayData.alloc)(input);
    }
    else {
      *state = *state + uStack_70._4_4_;
      *puVar17 = (uint)uStack_70;
      if ((uint)uStack_70 != 2) goto LAB_003e796c;
      if ((char)local_68 == '\x01') {
        this_00 = &input[0x33].d.size;
        ::QVariant::QVariant((QVariant *)&local_58,(QDateTime *)&local_78);
        cVar11 = ::QVariant::equals((QVariant *)this_00);
        ::QVariant::~QVariant((QVariant *)&local_58);
        if (cVar11 != '\0') goto LAB_003e7906;
        ::QVariant::QVariant((QVariant *)&local_58,(QDateTime *)&local_78);
        ::QVariant::operator=((QVariant *)this_00,(QVariant *)&local_58);
        ::QVariant::~QVariant((QVariant *)&local_58);
        (*(code *)(input->d).d[0xf].super_QArrayData.alloc)(input);
        ::QVariant::QVariant((QVariant *)&local_58,(QDateTime *)&local_78);
        (*(code *)(input->d).d[0xd].super_QArrayData.alloc)(&local_98,input,&local_58);
        pQVar8 = *(QArrayData **)position;
        uVar9 = *(undefined8 *)(position + 2);
        *(QArrayData **)position = local_98;
        *(undefined8 *)(position + 2) = uStack_90;
        uVar10 = *(undefined8 *)(position + 4);
        *(undefined8 *)(position + 4) = local_88;
        local_98 = pQVar8;
        uStack_90 = uVar9;
        local_88 = uVar10;
        if (pQVar8 != (QArrayData *)0x0) {
          LOCK();
          (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar8,2,0x10);
          }
        }
        ::QVariant::~QVariant((QVariant *)&local_58);
        ::QVariant::QVariant((QVariant *)&local_58,(QDateTime *)&local_78);
        updateCache((QDateTimeEditPrivate *)input,(QVariant *)&local_58,(QString *)position);
        ::QVariant::~QVariant((QVariant *)&local_58);
        ::QVariant::clear();
      }
      else {
LAB_003e7906:
        QString::operator=(input + 0x22,(QString *)position);
        *(uint *)&input[0x28].d.ptr = *puVar17;
        ::QVariant::QVariant((QVariant *)&local_58,(QDateTime *)&local_78);
        ::QVariant::operator=((QVariant *)(input + 0x23),(QVariant *)&local_58);
        ::QVariant::~QVariant((QVariant *)&local_58);
      }
    }
    cVar11 = QDateTime::isNull();
    if (cVar11 == '\0') {
      QDateTime::QDateTime((QDateTime *)this,(QDateTime *)&local_78);
    }
    else {
      (*(code *)(input->d).d[10].super_QArrayData.alloc)(&local_58,input);
      ::QVariant::toDateTime();
      ::QVariant::~QVariant((QVariant *)&local_58);
    }
    QDateTime::~QDateTime((QDateTime *)&local_78);
  }
LAB_003e79ce:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
LAB_003e7b11:
  __stack_chk_fail();
}

Assistant:

QDateTime QDateTimeEditPrivate::validateAndInterpret(QString &input, int &position,
                                                     QValidator::State &state, bool fixup) const
{
    if (input.isEmpty()) {
        if (sectionNodes.size() == 1 || !specialValueText.isEmpty()) {
            state = QValidator::Intermediate;
        } else {
            state = QValidator::Invalid;
        }
        return getZeroVariant().toDateTime();
    } else if (cachedText == input && !fixup) {
        state = cachedState;
        return cachedValue.toDateTime();
    } else if (!specialValueText.isEmpty()) {
        bool changeCase = false;
        const int max = qMin(specialValueText.size(), input.size());
        int i;
        for (i=0; i<max; ++i) {
            const QChar ic = input.at(i);
            const QChar sc = specialValueText.at(i);
            if (ic != sc) {
                if (sc.toLower() == ic.toLower()) {
                    changeCase = true;
                } else {
                    break;
                }
            }
        }
        if (i == max) {
            state = specialValueText.size() == input.size() ? QValidator::Acceptable : QValidator::Intermediate;
            if (changeCase) {
                input = specialValueText.left(max);
            }
            return minimum.toDateTime();
        }
    }

    StateNode tmp = parse(input, position, value.toDateTime(), fixup);
    // Take note of any corrections imposed during parsing:
    input = m_text;
    // TODO: if the format specifies time-zone, update timeZone to match the
    // parsed text; but we're in const context, so can't - QTBUG-118393.
    // Impose this widget's time system:
    tmp.value = tmp.value.toTimeZone(timeZone);
    // ... but that might turn a valid datetime into an invalid one:
    if (!tmp.value.isValid() && tmp.state == Acceptable)
        tmp.state = Intermediate;

    position += tmp.padded;
    state = QValidator::State(int(tmp.state));
    if (state == QValidator::Acceptable) {
        if (tmp.conflicts && conflictGuard != tmp.value) {
            conflictGuard = tmp.value;
            clearCache();
            input = textFromValue(tmp.value);
            updateCache(tmp.value, input);
            conflictGuard.clear();
        } else {
            cachedText = input;
            cachedState = state;
            cachedValue = tmp.value;
        }
    } else {
        clearCache();
    }
    return (tmp.value.isNull() ? getZeroVariant().toDateTime() : tmp.value);
}